

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ReadStartFunction(WasmBinaryReader *this)

{
  bool bVar1;
  ArgSlot AVar2;
  uint funcIndex;
  Type funcType_00;
  uint32 uVar3;
  WasmFunctionInfo *this_00;
  WasmSignature *this_01;
  WasmSignature *sig;
  Type funcType;
  uint32 id;
  uint32 len;
  WasmBinaryReader *this_local;
  
  funcType = ImportThunk;
  _id = this;
  funcIndex = LEB128<unsigned_int,32u>(this,(uint32 *)&funcType);
  funcType_00 = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,funcIndex);
  bVar1 = FunctionIndexTypes::CanBeExported(funcType_00);
  if (!bVar1) {
    ThrowDecodingError(this,L"Invalid function index for start function %u",(ulong)funcIndex);
  }
  this_00 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,funcIndex);
  this_01 = WasmFunctionInfo::GetSignature(this_00);
  AVar2 = WasmSignature::GetParamCount(this_01);
  if (AVar2 == 0) {
    uVar3 = WasmSignature::GetResultCount(this_01);
    if (uVar3 == 0) {
      Js::WebAssemblyModule::SetStartFunction(this->m_module,funcIndex);
      return;
    }
  }
  ThrowDecodingError(this,L"Start function must be void and nullary");
}

Assistant:

void WasmBinaryReader::ReadStartFunction()
{
    uint32 len = 0;
    uint32 id = LEB128(len);
    Wasm::FunctionIndexTypes::Type funcType = m_module->GetFunctionIndexType(id);
    if (!FunctionIndexTypes::CanBeExported(funcType))
    {
        ThrowDecodingError(_u("Invalid function index for start function %u"), id);
    }
    WasmSignature* sig = m_module->GetWasmFunctionInfo(id)->GetSignature();
    if (sig->GetParamCount() > 0 || sig->GetResultCount())
    {
        ThrowDecodingError(_u("Start function must be void and nullary"));
    }
    m_module->SetStartFunction(id);
}